

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void addObjectTypeNode(UA_Server *server,char *name,UA_UInt32 objecttypeid,UA_UInt32 parent,
                      UA_UInt32 parentreference)

{
  void *pvVar1;
  UA_Node *node;
  UA_AddNodesResult res;
  UA_NodeId local_40;
  
  pvVar1 = calloc(1,0xb0);
  if (pvVar1 == (void *)0x0) {
    pvVar1 = (void *)0x0;
  }
  else {
    *(undefined4 *)((long)pvVar1 + 0x20) = 8;
  }
  node = (UA_Node *)((long)pvVar1 + 8);
  if (pvVar1 == (void *)0x0) {
    node = (UA_Node *)0x0;
  }
  copyNames(node,name);
  (node->nodeId).identifier.numeric = objecttypeid;
  res.addedNodeId.identifier._8_2_ = 0;
  stack0xffffffffffffffac = 0x2d00000000;
  local_40.namespaceIndex = 0;
  local_40._4_8_ = 0x3a00000000;
  res.statusCode = 0;
  res._4_4_ = 0;
  res.addedNodeId.namespaceIndex = 0;
  res.addedNodeId._2_2_ = 0;
  res.addedNodeId.identifierType = UA_NODEIDTYPE_NUMERIC;
  res.addedNodeId.identifier.string.length = 0;
  Service_AddNodes_existing
            (server,&adminSession,node,&local_40,
             (UA_NodeId *)((long)&res.addedNodeId.identifier + 8),&UA_NODEID_NULL,
             (UA_InstantiationCallback *)0x0,(UA_NodeId *)&res);
  return;
}

Assistant:

static void
addObjectTypeNode(UA_Server *server, char* name, UA_UInt32 objecttypeid,
                  UA_UInt32 parent, UA_UInt32 parentreference) {
    UA_ObjectTypeNode *objecttype = UA_NodeStore_newObjectTypeNode();
    copyNames((UA_Node*)objecttype, name);
    objecttype->nodeId.identifier.numeric = objecttypeid;
    addNodeInternal(server, (UA_Node*)objecttype, UA_NODEID_NUMERIC(0, parent),
                    UA_NODEID_NUMERIC(0, parentreference));
}